

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphical_model.h
# Opt level: O0

void __thiscall
merlin::graphical_model::erase
          (graphical_model *this,
          vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
          *adj,findex idx,variable_set *vs)

{
  ulong uVar1;
  findex this_00;
  size_t sVar2;
  reference this_01;
  variable local_40;
  ulong local_30;
  size_t i;
  variable_set *vs_local;
  findex idx_local;
  vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_> *adj_local;
  graphical_model *this_local;
  
  local_30 = 0;
  i = (size_t)vs;
  vs_local = (variable_set *)idx;
  idx_local = (findex)adj;
  adj_local = (vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
               *)this;
  while( true ) {
    uVar1 = local_30;
    sVar2 = variable_set::nvar((variable_set *)i);
    this_00 = idx_local;
    if (sVar2 <= uVar1) break;
    local_40 = variable_set::operator[]((variable_set *)i,local_30);
    sVar2 = variable::operator_cast_to_unsigned_long(&local_40);
    this_01 = std::
              vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
              ::operator[]((vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                            *)this_00,sVar2);
    my_set<unsigned_long>::operator/=(this_01,(unsigned_long *)&vs_local);
    local_30 = local_30 + 1;
  }
  return;
}

Assistant:

void erase(std::vector<flist>& adj, findex idx, const variable_set& vs) {
		for (size_t i = 0; i < vs.nvar(); ++i)
			adj[vs[i]] /= idx; 		//   remove a factor from each var's adj list
	}